

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *cctx,ZSTD_EndDirective endOp,size_t inSize)

{
  ZSTD_dictContentType_e dictContentType;
  void *pvVar1;
  void *dict;
  void *pvVar2;
  ZSTD_paramSwitch_e ZVar3;
  ZSTD_freeFunction p_Var4;
  ZSTD_customMem customMem;
  ZSTD_customMem cMem;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params params;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ZSTD_cParamMode_e mode;
  U32 UVar8;
  ZSTD_CDict *pZVar9;
  ZSTDMT_CCtx *mtctx;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  U64 pledgedSrcSize;
  unsigned_long_long pledgedSrcSize_00;
  ZSTD_CCtx_params *pZVar13;
  undefined8 *puVar14;
  bool bVar15;
  byte bVar16;
  ZSTD_allocFunction in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined1 auVar17 [12];
  undefined1 auVar18 [24];
  undefined1 auVar19 [24];
  undefined1 in_stack_fffffffffffffe04 [180];
  unsigned_long_long *local_140;
  ZSTD_compressionParameters local_128;
  ZSTD_CCtx_params local_100;
  
  bVar16 = 0;
  memcpy(&local_100,&cctx->requestedParams,0xd0);
  pvVar1 = (cctx->localDict).dict;
  dict = (cctx->prefixDict).dict;
  sVar11 = (cctx->prefixDict).dictSize;
  dictContentType = (cctx->prefixDict).dictContentType;
  if (pvVar1 == (void *)0x0) {
    if ((cctx->localDict).dictBuffer != (void *)0x0) {
      __assert_fail("dl->dictBuffer == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5595,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("dl->cdict == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5596,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).dictSize != 0) {
      __assert_fail("dl->dictSize == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5597,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
LAB_001967d6:
    (cctx->prefixDict).dict = (void *)0x0;
    (cctx->prefixDict).dictSize = 0;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    pZVar9 = cctx->cdict;
    bVar15 = pZVar9 == (ZSTD_CDict *)0x0;
    if (dict == (void *)0x0) {
      bVar5 = true;
      if (pvVar1 == (void *)0x0 && pZVar9 != (ZSTD_CDict *)0x0) {
        local_100.compressionLevel = pZVar9->compressionLevel;
        bVar15 = false;
      }
    }
    else {
      if (pZVar9 != (ZSTD_CDict *)0x0) {
        __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6898,
                      "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                     );
      }
      bVar15 = true;
      bVar5 = false;
      pZVar9 = (ZSTD_CDict *)0x0;
    }
  }
  else {
    pZVar9 = (cctx->localDict).cdict;
    if (pZVar9 != (ZSTD_CDict *)0x0) {
      if (cctx->cdict != pZVar9) {
        __assert_fail("cctx->cdict == dl->cdict",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x559c,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      goto LAB_001967d6;
    }
    sVar10 = (cctx->localDict).dictSize;
    if (sVar10 == 0) {
      __assert_fail("dl->dictSize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x559f,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if (cctx->cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("cctx->cdict == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x55a0,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if (dict != (void *)0x0) {
      __assert_fail("cctx->prefixDict.dict == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x55a1,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    pvVar2 = (cctx->customMem).opaque;
    in_stack_fffffffffffffdf8 = SUB84(pvVar2,0);
    in_stack_fffffffffffffdfc = (undefined4)((ulong)pvVar2 >> 0x20);
    in_stack_fffffffffffffde8 = (cctx->customMem).customAlloc;
    p_Var4 = (cctx->customMem).customFree;
    in_stack_fffffffffffffdf0 = SUB84(p_Var4,0);
    in_stack_fffffffffffffdf4 = (undefined4)((ulong)p_Var4 >> 0x20);
    customMem.customFree._4_4_ = in_stack_fffffffffffffdf4;
    customMem._0_12_ = *(undefined1 (*) [12])&cctx->customMem;
    customMem.opaque._0_4_ = in_stack_fffffffffffffdf8;
    customMem.opaque._4_4_ = in_stack_fffffffffffffdfc;
    pZVar9 = ZSTD_createCDict_advanced2
                       (pvVar1,sVar10,ZSTD_dlm_byRef,(cctx->localDict).dictContentType,
                        &cctx->requestedParams,customMem);
    (cctx->localDict).cdict = pZVar9;
    if (pZVar9 == (ZSTD_CDict *)0x0) {
      return 0xffffffffffffffc0;
    }
    cctx->cdict = pZVar9;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    (cctx->prefixDict).dict = (void *)0x0;
    (cctx->prefixDict).dictSize = 0;
    bVar5 = true;
    bVar15 = false;
  }
  if (endOp == ZSTD_e_end) {
    cctx->pledgedSrcSizePlusOne = inSize + 1;
  }
  if (bVar5) {
    if (bVar15) {
      pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
      mode = ZSTD_cpm_noAttachDict;
      sVar10 = 0;
      goto LAB_00196943;
    }
    pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
    sVar10 = pZVar9->dictContentSize;
  }
  else {
    pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
    mode = ZSTD_cpm_noAttachDict;
    sVar10 = sVar11;
    if (bVar15) goto LAB_00196943;
  }
  mode = ZSTD_shouldAttachDict(pZVar9,&local_100,pledgedSrcSize);
LAB_00196943:
  local_140 = &cctx->pledgedSrcSizePlusOne;
  ZSTD_getCParamsFromCCtxParams(&local_128,&local_100,pledgedSrcSize,sVar10,mode);
  local_100.cParams.targetLength = local_128.targetLength;
  local_100.cParams.strategy = local_128.strategy;
  uVar7 = local_100.cParams._20_8_;
  local_100.cParams.windowLog = local_128.windowLog;
  local_100.cParams.chainLog = local_128.chainLog;
  uVar6 = local_100.cParams._0_8_;
  local_100.cParams.strategy = local_128.strategy;
  local_100.cParams.windowLog = local_128.windowLog;
  if (local_100.useBlockSplitter == ZSTD_ps_auto) {
    if (local_100.cParams.strategy < ZSTD_btopt) {
      local_100.useBlockSplitter = ZSTD_ps_disable;
    }
    else {
      local_100.useBlockSplitter = (local_100.cParams.windowLog < 0x11) + ZSTD_ps_enable;
    }
  }
  if (local_100.ldmParams.enableLdm == ZSTD_ps_auto) {
    if (local_100.cParams.strategy < ZSTD_btopt) {
      local_100.ldmParams.enableLdm = ZSTD_ps_disable;
    }
    else {
      local_100.ldmParams.enableLdm = (local_100.cParams.windowLog < 0x1b) + ZSTD_ps_enable;
    }
  }
  if (local_100.useRowMatchFinder == ZSTD_ps_auto) {
    if (local_100.cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
      local_100.useRowMatchFinder = ZSTD_ps_disable;
    }
    else {
      local_100.useRowMatchFinder = (local_100.cParams.windowLog < 0xf) + ZSTD_ps_enable;
    }
  }
  sVar10 = 0x20000;
  if (local_100.maxBlockSize != 0) {
    sVar10 = local_100.maxBlockSize;
  }
  local_100.maxBlockSize = sVar10;
  ZVar3 = (local_100.compressionLevel < 10) + ZSTD_ps_enable;
  if (local_100.searchForExternalRepcodes != ZSTD_ps_auto) {
    ZVar3 = local_100.searchForExternalRepcodes;
  }
  local_100.searchForExternalRepcodes = ZVar3;
  if (local_100.useSequenceProducer == 1 && 0 < local_100.nbWorkers) {
    return 0xffffffffffffffd7;
  }
  pledgedSrcSize_00 = *local_140 - 1;
  local_100.cParams._0_8_ = uVar6;
  local_100.cParams._20_8_ = uVar7;
  if (pledgedSrcSize_00 < 0x80001) {
    local_100.nbWorkers = 0;
  }
  else if (0 < local_100.nbWorkers) {
    mtctx = cctx->mtctx;
    if (mtctx == (ZSTDMT_CCtx *)0x0) {
      pvVar1 = (cctx->customMem).opaque;
      in_stack_fffffffffffffdf8 = SUB84(pvVar1,0);
      in_stack_fffffffffffffdfc = (undefined4)((ulong)pvVar1 >> 0x20);
      in_stack_fffffffffffffde8 = (cctx->customMem).customAlloc;
      p_Var4 = (cctx->customMem).customFree;
      in_stack_fffffffffffffdf0 = SUB84(p_Var4,0);
      in_stack_fffffffffffffdf4 = (undefined4)((ulong)p_Var4 >> 0x20);
      cMem.customFree._4_4_ = in_stack_fffffffffffffdf4;
      cMem._0_12_ = *(undefined1 (*) [12])&cctx->customMem;
      cMem.opaque._0_4_ = in_stack_fffffffffffffdf8;
      cMem.opaque._4_4_ = in_stack_fffffffffffffdfc;
      mtctx = ZSTDMT_createCCtx_advanced(local_100.nbWorkers,cMem,cctx->pool);
      cctx->mtctx = mtctx;
      if (mtctx == (ZSTDMT_CCtx *)0x0) {
        return 0xffffffffffffffc0;
      }
      pledgedSrcSize_00 = *local_140 - 1;
    }
    pZVar9 = cctx->cdict;
    pZVar13 = &local_100;
    puVar14 = (undefined8 *)&stack0xfffffffffffffde8;
    for (lVar12 = 0x1a; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar14 = *(undefined8 *)pZVar13;
      pZVar13 = (ZSTD_CCtx_params *)((long)pZVar13 + ((ulong)bVar16 * -2 + 1) * 8);
      puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
    }
    params.cParams.chainLog = in_stack_fffffffffffffdf0;
    params._0_8_ = in_stack_fffffffffffffde8;
    params.cParams.hashLog = in_stack_fffffffffffffdf4;
    params.cParams.searchLog = in_stack_fffffffffffffdf8;
    params.cParams.minMatch = in_stack_fffffffffffffdfc;
    params.cParams.targetLength = in_stack_fffffffffffffe00;
    auVar17 = in_stack_fffffffffffffe04._4_12_;
    auVar18 = in_stack_fffffffffffffe04._68_24_;
    auVar19 = in_stack_fffffffffffffe04._124_24_;
    params.cParams.strategy = in_stack_fffffffffffffe04._0_4_;
    params.fParams.contentSizeFlag = auVar17._0_4_;
    params.fParams.checksumFlag = auVar17._4_4_;
    params.fParams.noDictIDFlag = auVar17._8_4_;
    params.compressionLevel = in_stack_fffffffffffffe04._16_4_;
    params.forceWindow = in_stack_fffffffffffffe04._20_4_;
    params._52_4_ = in_stack_fffffffffffffe04._24_4_;
    params.targetCBlockSize = in_stack_fffffffffffffe04._28_8_;
    params.srcSizeHint = in_stack_fffffffffffffe04._36_4_;
    params.attachDictPref = in_stack_fffffffffffffe04._40_4_;
    params.literalCompressionMode = in_stack_fffffffffffffe04._44_4_;
    params.nbWorkers = in_stack_fffffffffffffe04._48_4_;
    params.jobSize = in_stack_fffffffffffffe04._52_8_;
    params.overlapLog = in_stack_fffffffffffffe04._60_4_;
    params.rsyncable = in_stack_fffffffffffffe04._64_4_;
    params.ldmParams.enableLdm = auVar18._0_4_;
    params.ldmParams.hashLog = auVar18._4_4_;
    params.ldmParams.bucketSizeLog = auVar18._8_4_;
    params.ldmParams.minMatchLength = auVar18._12_4_;
    params.ldmParams.hashRateLog = auVar18._16_4_;
    params.ldmParams.windowLog = auVar18._20_4_;
    params.enableDedicatedDictSearch = in_stack_fffffffffffffe04._92_4_;
    params.inBufferMode = in_stack_fffffffffffffe04._96_4_;
    params.outBufferMode = in_stack_fffffffffffffe04._100_4_;
    params.blockDelimiters = in_stack_fffffffffffffe04._104_4_;
    params.validateSequences = in_stack_fffffffffffffe04._108_4_;
    params.useBlockSplitter = in_stack_fffffffffffffe04._112_4_;
    params.useRowMatchFinder = in_stack_fffffffffffffe04._116_4_;
    params.deterministicRefPrefix = in_stack_fffffffffffffe04._120_4_;
    params.customMem.customAlloc = (ZSTD_allocFunction)auVar19._0_8_;
    params.customMem.customFree = (ZSTD_freeFunction)auVar19._8_8_;
    params.customMem.opaque = (void *)auVar19._16_8_;
    params.prefetchCDictTables = in_stack_fffffffffffffe04._148_4_;
    params.enableMatchFinderFallback = in_stack_fffffffffffffe04._152_4_;
    params.useSequenceProducer = in_stack_fffffffffffffe04._156_4_;
    params._188_4_ = in_stack_fffffffffffffe04._160_4_;
    params.maxBlockSize = in_stack_fffffffffffffe04._164_8_;
    params.searchForExternalRepcodes = in_stack_fffffffffffffe04._172_4_;
    params._204_4_ = in_stack_fffffffffffffe04._176_4_;
    sVar10 = ZSTDMT_initCStream_internal
                       (mtctx,dict,sVar11,dictContentType,pZVar9,params,pledgedSrcSize_00);
    if (sVar10 < 0xffffffffffffff89) {
      pZVar9 = cctx->cdict;
      if (pZVar9 == (ZSTD_CDict *)0x0) {
        UVar8 = 0;
      }
      else {
        UVar8 = pZVar9->dictID;
        sVar11 = pZVar9->dictContentSize;
      }
      cctx->dictID = UVar8;
      cctx->dictContentSize = sVar11;
      cctx->consumedSrcSize = 0;
      cctx->producedCSize = 0;
      cctx->streamStage = zcss_load;
      memcpy(&cctx->appliedParams,&local_100,0xd0);
      return 0;
    }
    return sVar10;
  }
  cParams.hashLog = local_128.hashLog;
  cParams.windowLog = local_128.windowLog;
  cParams.chainLog = local_128.chainLog;
  cParams.searchLog = local_128.searchLog;
  cParams.minMatch = local_128.minMatch;
  cParams.targetLength = local_128.targetLength;
  cParams.strategy = local_100.cParams.strategy;
  sVar10 = ZSTD_checkCParams(cParams);
  if (0xffffffffffffff88 < sVar10) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x68d8,
                  "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)");
  }
  sVar11 = ZSTD_compressBegin_internal
                     (cctx,dict,sVar11,dictContentType,ZSTD_dtlm_fast,cctx->cdict,&local_100,
                      pledgedSrcSize_00,ZSTDb_buffered);
  if (sVar11 < 0xffffffffffffff89) {
    if ((cctx->appliedParams).nbWorkers == 0) {
      cctx->inToCompress = 0;
      cctx->inBuffPos = 0;
      if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
        sVar11 = (ulong)(cctx->blockSize == pledgedSrcSize_00) + cctx->blockSize;
      }
      else {
        sVar11 = 0;
      }
      cctx->inBuffTarget = sVar11;
      cctx->outBuffContentSize = 0;
      cctx->outBuffFlushedSize = 0;
      cctx->streamStage = zcss_load;
      cctx->frameEnded = 0;
      return 0;
    }
    __assert_fail("cctx->appliedParams.nbWorkers == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x68de,
                  "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)");
  }
  return sVar11;
}

Assistant:

static size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx* cctx,
                                             ZSTD_EndDirective endOp,
                                             size_t inSize)
{
    ZSTD_CCtx_params params = cctx->requestedParams;
    ZSTD_prefixDict const prefixDict = cctx->prefixDict;
    FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) , ""); /* Init the local dict if present. */
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
    assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
    if (cctx->cdict && !cctx->localDict.cdict) {
        /* Let the cdict's compression level take priority over the requested params.
         * But do not take the cdict's compression level if the "cdict" is actually a localDict
         * generated from ZSTD_initLocalDict().
         */
        params.compressionLevel = cctx->cdict->compressionLevel;
    }
    DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
    if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = inSize + 1;  /* auto-determine pledgedSrcSize */

    {   size_t const dictSize = prefixDict.dict
                ? prefixDict.dictSize
                : (cctx->cdict ? cctx->cdict->dictContentSize : 0);
        ZSTD_cParamMode_e const mode = ZSTD_getCParamMode(cctx->cdict, &params, cctx->pledgedSrcSizePlusOne - 1);
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &params, cctx->pledgedSrcSizePlusOne-1,
                dictSize, mode);
    }

    params.useBlockSplitter = ZSTD_resolveBlockSplitterMode(params.useBlockSplitter, &params.cParams);
    params.ldmParams.enableLdm = ZSTD_resolveEnableLdm(params.ldmParams.enableLdm, &params.cParams);
    params.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params.useRowMatchFinder, &params.cParams);
    params.validateSequences = ZSTD_resolveExternalSequenceValidation(params.validateSequences);
    params.maxBlockSize = ZSTD_resolveMaxBlockSize(params.maxBlockSize);
    params.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(params.searchForExternalRepcodes, params.compressionLevel);

#ifdef ZSTD_MULTITHREAD
    /* If external matchfinder is enabled, make sure to fail before checking job size (for consistency) */
    RETURN_ERROR_IF(
        params.useSequenceProducer == 1 && params.nbWorkers >= 1,
        parameter_combination_unsupported,
        "External sequence producer isn't supported with nbWorkers >= 1"
    );

    if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
        params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
    }
    if (params.nbWorkers > 0) {
#if ZSTD_TRACE
        cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
        /* mt context creation */
        if (cctx->mtctx == NULL) {
            DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                        params.nbWorkers);
            cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem, cctx->pool);
            RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation, "NULL pointer!");
        }
        /* mt compression */
        DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
        FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                    cctx->mtctx,
                    prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                    cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) , "");
        cctx->dictID = cctx->cdict ? cctx->cdict->dictID : 0;
        cctx->dictContentSize = cctx->cdict ? cctx->cdict->dictContentSize : prefixDict.dictSize;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        cctx->appliedParams = params;
    } else
#endif  /* ZSTD_MULTITHREAD */
    {   U64 const pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
        assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
        FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType, ZSTD_dtlm_fast,
                cctx->cdict,
                &params, pledgedSrcSize,
                ZSTDb_buffered) , "");
        assert(cctx->appliedParams.nbWorkers == 0);
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if (cctx->appliedParams.inBufferMode == ZSTD_bm_buffered) {
            /* for small input: avoid automatic flush on reaching end of block, since
            * it would require to add a 3-bytes null block to end frame
            */
            cctx->inBuffTarget = cctx->blockSize + (cctx->blockSize == pledgedSrcSize);
        } else {
            cctx->inBuffTarget = 0;
        }
        cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
    }
    return 0;
}